

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

ssize_t __thiscall
pugi::impl::anon_unknown_0::xml_buffered_writer::write
          (xml_buffered_writer *this,int __fd,void *__buf,size_t __n)

{
  ssize_t in_RAX;
  ssize_t extraout_RAX;
  ulong size;
  char_t in_R8B;
  
  size = this->bufsize;
  if (0x7fc < size) {
    flush(this,this->buffer,size);
    size = 0;
    in_RAX = extraout_RAX;
  }
  this->buffer[size] = (char_t)__fd;
  this->buffer[size + 1] = (char_t)__buf;
  this->buffer[size + 2] = (char_t)__n;
  this->buffer[size + 3] = in_R8B;
  this->bufsize = size + 4;
  return in_RAX;
}

Assistant:

void write(char_t d0, char_t d1, char_t d2, char_t d3)
		{
			size_t offset = bufsize;
			if (offset > bufcapacity - 4) offset = flush();

			buffer[offset + 0] = d0;
			buffer[offset + 1] = d1;
			buffer[offset + 2] = d2;
			buffer[offset + 3] = d3;
			bufsize = offset + 4;
		}